

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
::Unordered_set_column<std::vector<int,std::allocator<int>>>
          (Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
           *this,Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
                 *column,Index columnIndex,vector<int,_std::allocator<int>_> *rowContainer,
          Column_settings *colSettings)

{
  Field_operators *pFVar1;
  __node_base *p_Var2;
  allocator_type local_23;
  key_equal local_22;
  EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
  local_21;
  
  *(Dimension *)this = (column->super_Column_dimension_option).dim_;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)(this + 8),(column->column_)._M_h._M_bucket_count,&local_21,&local_22,&local_23);
  pFVar1 = (Field_operators *)0x0;
  if (colSettings == (Column_settings *)0x0) {
    pFVar1 = column->operators_;
  }
  *(Field_operators **)(this + 0x40) = pFVar1;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = (Column_settings *)column->entryPool_;
  }
  *(Column_settings **)(this + 0x48) = colSettings;
  p_Var2 = &(column->column_)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
    ::_insert_entry((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
                     *)this,*(ID_index *)&(p_Var2[1]._M_nxt)->_M_nxt);
  }
  return;
}

Assistant:

inline Unordered_set_column<Master_matrix>::Unordered_set_column(const Unordered_set_column& column,
                                                                 Index columnIndex,
                                                                 Row_container* rowContainer,
                                                                 Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      column_(column.column_.bucket_count()),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _insert_entry(entry->get_row_index());
    } else {
      _insert_entry(entry->get_element(), entry->get_row_index());
    }
  }
}